

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

ar_object ar_init(int method,int N)

{
  ar_object paVar1;
  double dVar2;
  int p;
  int logn;
  int ordermax;
  int i;
  ar_object obj;
  int N_local;
  int method_local;
  
  if (N < 1) {
    printf("\n Input Values cannot be Negative. Program Exiting. \n");
    exit(-1);
  }
  dVar2 = log((double)N);
  p = imin(N + -1,(int)(dVar2 * 10.0));
  if (method == 2) {
    p = imin(p,0xc);
  }
  paVar1 = (ar_object)malloc((long)(p + N) * 8 + 0x48);
  paVar1->ordermax = p;
  paVar1->order = p;
  paVar1->p = p;
  paVar1->N = N;
  paVar1->retval = 0;
  paVar1->method = method;
  for (logn = 0; logn < p; logn = logn + 1) {
    *(undefined8 *)(&paVar1[1].N + (long)logn * 2) = 0;
  }
  paVar1->phi = (double *)(paVar1 + 1);
  paVar1->res = (double *)(&paVar1[1].N + (long)p * 2);
  paVar1->optmethod = 5;
  paVar1->mean = 0.0;
  paVar1->var = 1.0;
  return paVar1;
}

Assistant:

ar_object ar_init(int method, int N) {
	ar_object obj = NULL;
	int i, ordermax,logn,p;


	if (N <= 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}
	//retval = 0 Input Error
	// retval = 1 Probable Success
	// retval = 4 Optimization Routine didn't converge
	// Retval = 15 Optimization Routine Encountered Inf/Nan Values

	logn = (int) (10.0 * log((double)N));
	ordermax = imin(N - 1, logn);

	if (method == 2) {
		ordermax = imin(ordermax, 12); // MLE
	}

	p = ordermax;

	obj = (ar_object)malloc(sizeof(struct ar_set) + sizeof(double)* (p + N));

	obj->p = obj->order = obj->ordermax = p;
	obj->N = N;
	obj->retval = 0;
	obj->method = method;

	for (i = 0; i < p; ++i) {
		obj->params[i] = 0.0;
	}
	obj->phi = &obj->params[0];
	obj->res = &obj->params[p];

	obj->optmethod = 5;// Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;

	return obj;
}